

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliZ.hpp
# Opt level: O2

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::PauliZ<std::complex<double>_>::matrix(PauliZ<std::complex<double>_> *this)

{
  complex<double> m10;
  undefined8 in_RCX;
  undefined8 in_RDX;
  data_type extraout_RDX;
  undefined8 unaff_RBX;
  undefined8 in_RSI;
  undefined8 in_R8;
  SquareMatrix<std::complex<double>_> SVar1;
  complex<double> m00;
  complex<double> m01;
  undefined8 unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  
  m10._M_value._8_8_ = unaff_retaddr;
  m10._M_value._0_8_ = unaff_RBX;
  m00._M_value._8_8_ = in_RDX;
  m00._M_value._0_8_ = in_RSI;
  m01._M_value._8_8_ = in_R8;
  m01._M_value._0_8_ = in_RCX;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)this,m00,m01,m10,
             (complex<double>)in_stack_00000008);
  SVar1.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)this;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 1 ,  0 ,
                                                  0 , -1 ) ;
        }